

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O1

void Curl_hash_clean_with_criterium(Curl_hash *h,void *user,_func_int_void_ptr_void_ptr *comp)

{
  Curl_llist *pCVar1;
  Curl_llist_element *pCVar2;
  int iVar3;
  long lVar4;
  Curl_llist_element *e;
  
  if ((h != (Curl_hash *)0x0) && (0 < h->slots)) {
    lVar4 = 0;
    do {
      pCVar1 = h->table;
      e = pCVar1[lVar4].head;
      if (e != (Curl_llist_element *)0x0) {
        do {
          pCVar2 = e->next;
          if ((comp == (_func_int_void_ptr_void_ptr *)0x0) ||
             (iVar3 = (*comp)(user,*(void **)((long)e->ptr + 0x18)), iVar3 != 0)) {
            Curl_llist_remove(pCVar1 + lVar4,e,h);
            h->size = h->size - 1;
          }
          e = pCVar2;
        } while (pCVar2 != (Curl_llist_element *)0x0);
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < h->slots);
  }
  return;
}

Assistant:

void
Curl_hash_clean_with_criterium(struct Curl_hash *h, void *user,
                               int (*comp)(void *, void *))
{
  struct Curl_llist_element *le;
  struct Curl_llist_element *lnext;
  struct Curl_llist *list;
  int i;

  if(!h)
    return;

  for(i = 0; i < h->slots; ++i) {
    list = &h->table[i];
    le = list->head; /* get first list entry */
    while(le) {
      struct Curl_hash_element *he = le->ptr;
      lnext = le->next;
      /* ask the callback function if we shall remove this entry or not */
      if(!comp || comp(user, he->ptr)) {
        Curl_llist_remove(list, le, (void *) h);
        --h->size; /* one less entry in the hash now */
      }
      le = lnext;
    }
  }
}